

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O1

void form_global_comm(comm_data *param_1,comm_data *global_data,
                     vector<int,_std::allocator<int>_> *param_3,MPI_Comm mpi_comm,
                     topo_data *topo_info,int tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  size_type sVar13;
  vector<int,_std::allocator<int>_> node_sizes;
  vector<int,_std::allocator<int>_> node_ctr;
  int local_num_procs;
  int local_rank;
  int num_procs;
  int rank;
  value_type_conflict local_8c;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  pointer local_48;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  MPI_Comm_rank(&ompi_mpi_comm_world,local_34);
  MPI_Comm_size(&ompi_mpi_comm_world,local_38);
  MPI_Comm_rank(*(undefined8 *)(mpi_comm + 0x10),local_3c);
  MPI_Comm_size(*(undefined8 *)(mpi_comm + 0x10),local_40);
  iVar1 = *(int *)(mpi_comm + 8);
  local_8c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_88,(long)iVar1,&local_8c);
  if (0 < param_1->num_msgs) {
    piVar5 = (param_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = param_1->indptr;
    lVar10 = 0;
    do {
      iVar2 = piVar5[lVar10];
      iVar3 = piVar8[lVar10 + 1];
      iVar4 = piVar8[lVar10];
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar2] == 0) {
        global_data->num_msgs = global_data->num_msgs + 1;
      }
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar2] =
           local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar2] + (iVar3 - iVar4);
      lVar10 = lVar10 + 1;
    } while (lVar10 < param_1->num_msgs);
  }
  iVar2 = global_data->num_msgs;
  sVar13 = (size_type)iVar2;
  if (sVar13 != 0) {
    uVar11 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar11 = sVar13 * 4;
    }
    piVar8 = (int *)operator_new__(uVar11);
    global_data->procs = piVar8;
  }
  uVar11 = 0xffffffffffffffff;
  if (-2 < iVar2) {
    uVar11 = sVar13 * 4 + 4;
  }
  piVar8 = (int *)operator_new__(uVar11);
  global_data->indptr = piVar8;
  local_8c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_68,sVar13,&local_8c);
  global_data->num_msgs = 0;
  piVar8 = global_data->indptr;
  *piVar8 = 0;
  if (0 < iVar1) {
    sVar13 = 0;
    do {
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar13] != 0) {
        global_data->procs[global_data->num_msgs] = (int)sVar13;
        global_data->size_msgs =
             global_data->size_msgs +
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[sVar13];
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar13] = global_data->num_msgs;
        iVar2 = global_data->num_msgs;
        global_data->num_msgs = iVar2 + 1;
        piVar8[(long)iVar2 + 1] = global_data->size_msgs;
      }
      sVar13 = sVar13 + 1;
    } while ((long)iVar1 != sVar13);
  }
  iVar1 = global_data->size_msgs;
  if ((long)iVar1 != 0) {
    uVar11 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar11 = (long)iVar1 << 2;
    }
    piVar9 = (int *)operator_new__(uVar11);
    global_data->indices = piVar9;
  }
  if (0 < param_1->num_msgs) {
    local_48 = (param_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    piVar9 = param_1->indptr;
    lVar10 = 0;
    do {
      iVar1 = piVar9[lVar10];
      lVar12 = (long)iVar1;
      iVar2 = piVar9[lVar10 + 1];
      if (iVar1 < iVar2) {
        iVar1 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_48[lVar10]];
        piVar6 = param_1->indices;
        piVar7 = global_data->indices;
        do {
          iVar3 = piVar8[iVar1];
          iVar4 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar1];
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar1] = iVar4 + 1;
          piVar7[(long)iVar3 + (long)iVar4] = piVar6[lVar12];
          lVar12 = lVar12 + 1;
        } while (iVar2 != lVar12);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < param_1->num_msgs);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void form_global_comm(comm_data* local_data, comm_data* global_data,
        std::vector<int>& local_data_nodes, MPI_Comm mpi_comm,
        topo_data* topo_info, int tag)
{
    std::vector<int> tmp_send_indices;
    std::vector<int> node_sizes;
    std::vector<int> node_ctr;

    // Get MPI Information
    int rank, num_procs;
    int local_rank, local_num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);
    MPI_Comm& local_comm = topo_info->local_comm;
    MPI_Comm_rank(local_comm, &local_rank);
    MPI_Comm_size(local_comm, &local_num_procs);
    int num_nodes = topo_info->num_nodes;
    int rank_node = topo_info->rank_node;

    int node_idx;
    int start, end, idx;
    int ctr, node, size;

    node_sizes.resize(num_nodes, 0);

    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        size = local_data->indptr[i+1] - local_data->indptr[i];
        if (node_sizes[node] == 0)
        {
            global_data->num_msgs++;
        }
        node_sizes[node] += size;
    }
    if (global_data->num_msgs)
        global_data->procs = new int[global_data->num_msgs];
    global_data->indptr = new int[global_data->num_msgs+1];
    node_ctr.resize(global_data->num_msgs, 0);

    global_data->num_msgs = 0;
    global_data->indptr[0] = 0;
    for (int i = 0; i < num_nodes; i++)
    {
        if (node_sizes[i])
        {
            global_data->procs[global_data->num_msgs] = i;
            global_data->size_msgs += node_sizes[i];
            node_sizes[i] = global_data->num_msgs;
            global_data->num_msgs++;
            global_data->indptr[global_data->num_msgs] = global_data->size_msgs;
        }
    }

    if (global_data->size_msgs)
        global_data->indices = new int[global_data->size_msgs];
    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        node_idx = node_sizes[node];
        start = local_data->indptr[i];
        end = local_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = global_data->indptr[node_idx] + node_ctr[node_idx]++;
            global_data->indices[idx] = local_data->indices[j];
        }
    }
}